

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

CItem * __thiscall am_CList::Find(am_CList *this,Am_Constraint *item)

{
  CItem *local_28;
  CItem *curr;
  Am_Constraint *item_local;
  am_CList *this_local;
  
  local_28 = this->head;
  while( true ) {
    if (local_28 == (CItem *)0x0) {
      return (CItem *)0x0;
    }
    if (local_28->value == item) break;
    local_28 = local_28->next;
  }
  return local_28;
}

Assistant:

CItem *
am_CList::Find(Am_Constraint *item)
{
  CItem *curr = head;
  while (curr) {
    if (curr->value == item) {
      return curr;
    }
    curr = curr->next;
  }
  return nullptr;
}